

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

bool __thiscall QTextStreamPrivate::fillReadBuffer(QTextStreamPrivate *this,qint64 maxBytes)

{
  QString *a;
  ulong alloc;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype alloc_00;
  bool bVar3;
  QStringConverter *this_00;
  optional<QStringConverter::Encoding> oVar4;
  char16_t *pcVar5;
  char16_t expectedFirstCharacter;
  size_t in_RCX;
  long lVar6;
  void *__buf;
  char16_t *pcVar7;
  char16_t *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView data;
  char buf [16384];
  undefined1 local_4070 [8];
  QStringConverter *local_4068;
  storage_type *psStack_4060;
  qsizetype local_4058;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_4050;
  ClearDataFn p_Stack_4040;
  storage_type local_4038 [16384];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QIODevice::isTextModeEnabled(this->device);
  if (bVar3) {
    QIODevice::setTextModeEnabled(this->device,false);
  }
  memset(local_4038,0xaa,0x4000);
  __buf = (void *)0x4000;
  if (maxBytes < 0x4000) {
    __buf = (void *)maxBytes;
  }
  if (maxBytes == -1) {
    __buf = (void *)0x4000;
  }
  this_00 = (QStringConverter *)QIODevice::read(this->device,(int)local_4038,__buf,in_RCX);
  expectedFirstCharacter = (char16_t)in_RCX;
  if (bVar3) {
    QIODevice::setTextModeEnabled(this->device,true);
  }
  if (0 < (long)this_00) {
    if (this->autoDetectUnicode == true) {
      this->autoDetectUnicode = false;
      data.m_data = (storage_type *)0x0;
      data.m_size = (qsizetype)local_4038;
      oVar4 = QStringConverter::encodingForData(this_00,data,expectedFirstCharacter);
      if (((ulong)oVar4.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
                  super__Optional_payload_base<QStringConverter::Encoding> >> 0x20 & 1) != 0) {
        this->encoding =
             oVar4.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
             super__Optional_payload_base<QStringConverter::Encoding>._M_payload;
        local_4070 = (undefined1  [8])
                     (QStringConverter::encodingInterfaces +
                     ((ulong)oVar4.super__Optional_base<QStringConverter::Encoding,_true,_true>.
                             _M_payload.super__Optional_payload_base<QStringConverter::Encoding> &
                     0xffffffff));
        local_4068 = (QStringConverter *)0x0;
        psStack_4060 = (storage_type *)0x0;
        local_4058 = 0;
        aStack_4050.d[0] = (void *)0x0;
        aStack_4050.d[1] = (void *)0x0;
        p_Stack_4040 = (ClearDataFn)0x0;
        (this->toUtf16).super_QStringConverter.iface = (Interface *)local_4070;
        QStringConverterBase::State::clear(&(this->toUtf16).super_QStringConverter.state);
        (this->toUtf16).super_QStringConverter.state.flags.
        super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
        super_QFlagsStorage<QStringConverterBase::Flag>.i = (Int)local_4068._0_4_;
        (this->toUtf16).super_QStringConverter.state.remainingChars = (qsizetype)psStack_4060;
        (this->toUtf16).super_QStringConverter.state.invalidChars = local_4058;
        (this->toUtf16).super_QStringConverter.state.field_4.d[0] = aStack_4050.d[0];
        (this->toUtf16).super_QStringConverter.state.field_4.d[1] = aStack_4050.d[1];
        (this->toUtf16).super_QStringConverter.state.clearFn = p_Stack_4040;
        p_Stack_4040 = (ClearDataFn)0x0;
        QStringConverterBase::State::clear((State *)&local_4068);
        local_4070 = (undefined1  [8])(QStringConverter::encodingInterfaces + this->encoding);
        local_4068 = (QStringConverter *)0x0;
        psStack_4060 = (storage_type *)0x0;
        local_4058 = 0;
        aStack_4050.d[0] = (void *)0x0;
        aStack_4050.d[1] = (void *)0x0;
        p_Stack_4040 = (ClearDataFn)0x0;
        (this->fromUtf16).super_QStringConverter.iface = (Interface *)local_4070;
        QStringConverterBase::State::clear(&(this->fromUtf16).super_QStringConverter.state);
        (this->fromUtf16).super_QStringConverter.state.flags.
        super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
        super_QFlagsStorage<QStringConverterBase::Flag>.i = (Int)local_4068._0_4_;
        (this->fromUtf16).super_QStringConverter.state.remainingChars = (qsizetype)psStack_4060;
        (this->fromUtf16).super_QStringConverter.state.invalidChars = local_4058;
        (this->fromUtf16).super_QStringConverter.state.field_4.d[0] = aStack_4050.d[0];
        (this->fromUtf16).super_QStringConverter.state.field_4.d[1] = aStack_4050.d[1];
        (this->fromUtf16).super_QStringConverter.state.clearFn = p_Stack_4040;
        p_Stack_4040 = (ClearDataFn)0x0;
        QStringConverterBase::State::clear((State *)&local_4068);
      }
    }
    a = &this->readBuffer;
    uVar9 = (this->readBuffer).d.size;
    local_4070 = (undefined1  [8])&this->toUtf16;
    local_4068 = this_00;
    psStack_4060 = local_4038;
    ::operator+=(a,(EncodedData<QByteArrayView> *)local_4070);
    alloc = (this->readBuffer).d.size;
    if (bVar3 && uVar9 < alloc) {
      pDVar1 = (a->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(a,alloc,KeepSize);
      }
      pcVar8 = (this->readBuffer).d.ptr + uVar9;
      pDVar1 = (this->readBuffer).d.d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(a,(this->readBuffer).d.size,KeepSize);
      }
      pDVar1 = (this->readBuffer).d.d;
      pcVar2 = (this->readBuffer).d.ptr;
      pcVar7 = pcVar2 + uVar9;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(a,(this->readBuffer).d.size,KeepSize);
      }
      alloc_00 = (this->readBuffer).d.size;
      pcVar5 = (this->readBuffer).d.ptr + alloc_00;
      if (pcVar7 < pcVar5) {
        pcVar2 = pcVar2 + uVar9;
        do {
          pcVar7 = pcVar2 + 1;
          if (*pcVar2 == L'\r') break;
          uVar9 = uVar9 + 1;
          pcVar8 = pcVar8 + 1;
          pcVar2 = pcVar7;
        } while (pcVar8 != pcVar5);
      }
      if (pcVar7 < pcVar5) {
        lVar6 = this->readBufferOffset;
        do {
          if (*pcVar7 == L'\r') {
            if ((long)uVar9 < lVar6) {
              lVar6 = lVar6 + -1;
              this->readBufferOffset = lVar6;
            }
          }
          else {
            *pcVar8 = *pcVar7;
            pcVar8 = pcVar8 + 1;
          }
          pcVar7 = pcVar7 + 1;
          uVar9 = uVar9 + 1;
        } while (pcVar7 < pcVar5);
      }
      pDVar1 = (a->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(a,alloc_00,KeepSize);
      }
      QString::resize(a,(long)pcVar8 - (long)(this->readBuffer).d.ptr >> 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return 0 < (long)this_00;
}

Assistant:

bool QTextStreamPrivate::fillReadBuffer(qint64 maxBytes)
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    Q_ASSERT(!string);
    Q_ASSERT(device);

    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled)
        device->setTextModeEnabled(false);

    // read raw data into a temporary buffer
    char buf[QTEXTSTREAM_BUFFERSIZE];
    qint64 bytesRead = 0;
#if defined(Q_OS_WIN)
    // On Windows, there is no non-blocking stdin - so we fall back to reading
    // lines instead. If there is no QOBJECT, we read lines for all sequential
    // devices; otherwise, we read lines only for stdin.
    QFile *file = 0;
    Q_UNUSED(file);
    if (device->isSequential()
#if !defined(QT_NO_QOBJECT)
        && (file = qobject_cast<QFile *>(device)) && file->handle() == 0
#endif
        ) {
        if (maxBytes != -1)
            bytesRead = device->readLine(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->readLine(buf, sizeof(buf));
    } else
#endif
    {
        if (maxBytes != -1)
            bytesRead = device->read(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->read(buf, sizeof(buf));
    }

    // reset the Text flag.
    if (textModeEnabled)
        device->setTextModeEnabled(true);

    if (bytesRead <= 0)
        return false;

#ifndef QT_BOOTSTRAPPED
    if (autoDetectUnicode) {
        autoDetectUnicode = false;

        auto e = QStringConverter::encodingForData(QByteArrayView(buf, bytesRead));
        // QStringConverter::Locale implies unknown, so keep the current encoding
        if (e) {
            encoding = *e;
            toUtf16 = QStringDecoder(encoding);
            fromUtf16 = QStringEncoder(encoding);
        }
    }
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), using %s encoding", QStringConverter::nameForEncoding(encoding));
#endif
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), device->read(\"%s\", %d) == %d",
           QtDebugUtils::toPrintable(buf, bytesRead, 32).constData(),
           int(sizeof(buf)), int(bytesRead));
#endif

    qsizetype oldReadBufferSize = readBuffer.size();
    readBuffer += toUtf16(QByteArrayView(buf, bytesRead));

    // remove all '\r\n' in the string.
    if (readBuffer.size() > oldReadBufferSize && textModeEnabled) {
        QChar CR = u'\r';
        QChar *writePtr = readBuffer.data() + oldReadBufferSize;
        QChar *readPtr = readBuffer.data() + oldReadBufferSize;
        QChar *endPtr = readBuffer.data() + readBuffer.size();

        qsizetype n = oldReadBufferSize;
        if (readPtr < endPtr) {
            // Cut-off to avoid unnecessary self-copying.
            while (*readPtr++ != CR) {
                ++n;
                if (++writePtr == endPtr)
                    break;
            }
        }
        while (readPtr < endPtr) {
            QChar ch = *readPtr++;
            if (ch != CR) {
                *writePtr++ = ch;
            } else {
                if (n < readBufferOffset)
                    --readBufferOffset;
                --bytesRead;
            }
            ++n;
        }
        readBuffer.resize(writePtr - readBuffer.data());
    }

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer() read %d bytes from device. readBuffer = [%s]",
           int(bytesRead),
           QtDebugUtils::toPrintable(readBuffer.toLatin1(), readBuffer.size(),
                                     readBuffer.size()).constData());
#endif
    return true;
}